

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adjointcheckpointscheme.c
# Opt level: O0

SUNErrCode SUNAdjointCheckpointScheme_Destroy(SUNAdjointCheckpointScheme_conflict *check_scheme_ptr)

{
  long *in_RDI;
  SUNErrCode err;
  SUNContext sunctx_local_scope_;
  undefined4 local_4;
  
  if (*(long *)(*(long *)*in_RDI + 0x18) == 0) {
    if (*in_RDI != 0) {
      free(*(void **)*in_RDI);
      free((void *)*in_RDI);
    }
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(*(long *)*in_RDI + 0x18))(in_RDI);
  }
  return local_4;
}

Assistant:

SUNErrCode SUNAdjointCheckpointScheme_Destroy(
  SUNAdjointCheckpointScheme* check_scheme_ptr)
{
  SUNFunctionBegin((*check_scheme_ptr)->sunctx);
  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);
  if ((*check_scheme_ptr)->ops->destroy)
  {
    SUNErrCode err = (*check_scheme_ptr)->ops->destroy(check_scheme_ptr);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }
  else if (*check_scheme_ptr)
  {
    free((*check_scheme_ptr)->ops);
    free(*check_scheme_ptr);
  }
  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_SUCCESS;
}